

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::Nullify(internalJSONNode *this)

{
  json_string *pjVar1;
  internalJSONNode *this_local;
  
  this->_type = '\0';
  pjVar1 = jsonSingletonCONST_NULL::getValue_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->_string,(string *)pjVar1);
  SetFetched(this,true);
  return;
}

Assistant:

void internalJSONNode::Nullify(void) const json_nothrow {
    _type = JSON_NULL;
    #if(defined(JSON_CASTABLE) || !defined(JSON_LESS_MEMORY) || defined(JSON_WRITE_PRIORITY)) /*-> JSON_CASTABLE || !JSON_LESS_MEMORY || JSON_WRITE_PRIORITY */
	   _string = json_global(CONST_NULL);
    #else /*<- else */
	   clearString(_string);
    #endif /*<- */
    SetFetched(true);
}